

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

void __thiscall
helics::RandomDelayFilterOperation::setString
          (RandomDelayFilterOperation *this,string_view property,string_view val)

{
  int iVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  const_iterator cVar3;
  utilities *this_00;
  int *__s1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  size_t __n;
  char *pcVar4;
  char *pcVar5;
  size_type __rlen;
  string_view timeString;
  string_view timeString_00;
  key_type local_38;
  
  pcVar5 = val._M_str;
  this_00 = (utilities *)val._M_len;
  __s1 = (int *)property._M_str;
  __n = property._M_len;
  local_38._M_len = (size_t)this_00;
  local_38._M_str = pcVar5;
  switch(__n) {
  case 3:
    iVar1 = bcmp(__s1,"min",__n);
    pcVar4 = extraout_RDX;
    if (iVar1 != 0) {
      pcVar4 = "max";
LAB_0025bbb0:
      iVar1 = bcmp(__s1,pcVar4,__n);
      pcVar4 = extraout_RDX_02;
      if (iVar1 != 0) {
        return;
      }
LAB_0025bc12:
      timeString._M_str = pcVar4;
      timeString._M_len = (size_t)pcVar5;
      TVar2 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                        (this_00,timeString);
      LOCK();
      (((this->rdelayGen)._M_t.
        super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
        .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->param2).
      super___atomic_float<double>._M_fp =
           (double)(TVar2.internalTimeCode % 1000000000) * 1e-09 +
           (double)(TVar2.internalTimeCode / 1000000000);
      UNLOCK();
      return;
    }
    break;
  case 4:
    if (*__s1 == 0x74736964) goto LAB_0025bcdb;
    iVar1 = bcmp(__s1,"mean",__n);
    pcVar4 = extraout_RDX_01;
    if (iVar1 != 0) {
      pcVar4 = "beta";
      goto LAB_0025bbb0;
    }
    break;
  case 5:
    iVar1 = bcmp(__s1,"alpha",__n);
    pcVar4 = extraout_RDX_00;
    if (iVar1 != 0) {
      return;
    }
    break;
  case 6:
    iVar1 = bcmp(__s1,"param1",__n);
    pcVar4 = extraout_RDX_03;
    if (iVar1 != 0) {
      iVar1 = bcmp(__s1,"param2",__n);
      pcVar4 = extraout_RDX_04;
      if ((iVar1 != 0) && ((short)__s1[1] != 0x7665 || *__s1 != 0x64647473)) {
        return;
      }
      goto LAB_0025bc12;
    }
    break;
  default:
    goto switchD_0025bb3d_caseD_7;
  case 0xc:
    iVar1 = bcmp(__s1,"distribution",__n);
    if (iVar1 != 0) {
      return;
    }
LAB_0025bcdb:
    cVar3 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
            ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
                    *)distMap,&local_38);
    if (cVar3._M_node != (_Base_ptr)(distMap + 8)) {
      LOCK();
      (((this->rdelayGen)._M_t.
        super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
        .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->dist)._M_i =
           *(RandomDistributions *)&cVar3._M_node[1]._M_left;
      UNLOCK();
    }
    goto switchD_0025bb3d_caseD_7;
  }
  timeString_00._M_str = pcVar4;
  timeString_00._M_len = (size_t)pcVar5;
  TVar2 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                    (this_00,timeString_00);
  LOCK();
  (((this->rdelayGen)._M_t.
    super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
    .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->param1).
  super___atomic_float<double>._M_fp =
       (double)(TVar2.internalTimeCode % 1000000000) * 1e-09 +
       (double)(TVar2.internalTimeCode / 1000000000);
  UNLOCK();
switchD_0025bb3d_caseD_7:
  return;
}

Assistant:

void RandomDelayFilterOperation::setString(std::string_view property, std::string_view val)
{
    if ((property == "dist") || (property == "distribution")) {
        auto res = distMap.find(val);
        if (res != distMap.end()) {
            rdelayGen->dist.store(res->second);
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param1.store(static_cast<double>(time));
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        auto time = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        rdelayGen->param2.store(static_cast<double>(time));
    }
}